

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O2

void updateNewNetworkNameManager
               (Abc_Ntk_t *pNtk,Aig_Man_t *pAig,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vLoNames)

{
  int iVar1;
  uint uVar2;
  Nm_Man_t *pNVar3;
  void *pvVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  long *plVar7;
  int iVar8;
  
  pNVar3 = Nm_ManCreate(pNtk->vCis->nSize);
  pNtk->pManName = pNVar3;
  if (vPiNames != (Vec_Ptr_t *)0x0) {
    for (iVar8 = 0; iVar8 < pAig->nTruePis; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar5 = Abc_NtkCi(pNtk,iVar8);
      iVar1 = pAVar5->Id;
      pNVar3 = pNtk->pManName;
      uVar2 = *(uint *)((long)pvVar4 + 0x18);
      pcVar6 = (char *)Vec_PtrEntry(vPiNames,iVar8);
      Nm_ManStoreIdName(pNVar3,iVar1,uVar2 & 7,pcVar6,(char *)0x0);
    }
  }
  if (vLoNames != (Vec_Ptr_t *)0x0) {
    for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar8);
      pAVar5 = Abc_NtkCi(pNtk,pAig->nTruePis + iVar8);
      iVar1 = pAVar5->Id;
      pNVar3 = pNtk->pManName;
      uVar2 = *(uint *)((long)pvVar4 + 0x18);
      pcVar6 = (char *)Vec_PtrEntry(vLoNames,iVar8);
      Nm_ManStoreIdName(pNVar3,iVar1,uVar2 & 7,pcVar6,(char *)0x0);
    }
  }
  for (iVar8 = 0; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,iVar8);
    pcVar6 = Abc_ObjName(pAVar5);
    Abc_ObjAssignName(pAVar5,"assert_safety_",pcVar6);
  }
  for (iVar8 = 0; iVar8 < pNtk->vBoxes->nSize; iVar8 = iVar8 + 1) {
    plVar7 = (long *)Vec_PtrEntry(pNtk->vBoxes,iVar8);
    if ((*(uint *)((long)plVar7 + 0x14) & 0xf) == 8) {
      pcVar6 = Nm_ManFindNameById(pNtk->pManName,
                                  *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                                    (long)*(int *)plVar7[4] * 8) + 0x10));
      if (pcVar6 == (char *)0x0) {
        pAVar5 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8);
        pcVar6 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar5,pcVar6,(char *)0x0);
      }
    }
  }
  return;
}

Assistant:

void updateNewNetworkNameManager( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, Vec_Ptr_t *vPiNames, Vec_Ptr_t *vLoNames )
{
    Aig_Obj_t *pObj;
    Abc_Obj_t *pNode;
    int i, ntkObjId;

    pNtk->pManName = Nm_ManCreate( Abc_NtkCiNum( pNtk ) );

    if( vPiNames )
    {
        Saig_ManForEachPi( pAig, pObj, i )
        {
            ntkObjId = Abc_NtkCi( pNtk, i )->Id;
            //printf("Pi %d, Saved Name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vPiNames, i), NULL ), ntkObjId);  
            Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vPiNames, i), NULL );
        }
    }
    if( vLoNames )
    {
        Saig_ManForEachLo( pAig, pObj, i )
        {
            ntkObjId = Abc_NtkCi( pNtk, Saig_ManPiNum( pAig ) + i )->Id;
            //printf("Lo %d, Saved name = %s, id = %d\n", i, Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), Vec_PtrEntry(vLoNames, i), NULL ), ntkObjId);  
            Nm_ManStoreIdName( pNtk->pManName, ntkObjId, Aig_ObjType(pObj), (char *)Vec_PtrEntry(vLoNames, i), NULL );
        }
    }

    Abc_NtkForEachPo(pNtk, pNode, i)
    {
        Abc_ObjAssignName(pNode, "assert_safety_", Abc_ObjName(pNode) );
    }

    // assign latch input names
    Abc_NtkForEachLatch(pNtk, pNode, i)
        if ( Nm_ManFindNameById(pNtk->pManName, Abc_ObjFanin0(pNode)->Id) == NULL )
            Abc_ObjAssignName( Abc_ObjFanin0(pNode), Abc_ObjName(Abc_ObjFanin0(pNode)), NULL );
}